

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# singly_linked_list.cpp
# Opt level: O0

void __thiscall si9ma::SinglyLinkedList::insert(SinglyLinkedList *this,int val,int index)

{
  bool bVar1;
  SinglyNodeWithRand *this_00;
  SinglyNodeWithRand *node;
  SinglyNodeWithRand *pSVar2;
  SinglyNodeWithRand *prev;
  SinglyNodeWithRand *old_node;
  SinglyNodeWithRand *new_node;
  int index_local;
  int val_local;
  SinglyLinkedList *this_local;
  
  this_00 = (SinglyNodeWithRand *)operator_new(0x18);
  SinglyNodeWithRand::SinglyNodeWithRand(this_00,val);
  bVar1 = is_empty(this);
  if (bVar1) {
    this->tail = this_00;
    this->head = this_00;
    this->size = this->size + 1;
  }
  else {
    node = get_node(this,index);
    if (node == this->head) {
      this->head = this_00;
      this_00->next = node;
    }
    else {
      pSVar2 = get_prev(this,node);
      pSVar2->next = this_00;
      this_00->next = node;
    }
    this->size = this->size + 1;
  }
  return;
}

Assistant:

void SinglyLinkedList::insert(int val, int index) {
        auto *new_node = new SinglyNodeWithRand(val);

        if (is_empty()){
            head = tail = new_node;
            size++;
            return;
        }

        auto *old_node = get_node(index);
        if (old_node == head){
            head = new_node;
            new_node->next = old_node;
        } else{
            SinglyNodeWithRand *prev = get_prev(old_node);
            prev->next = new_node;
            new_node->next = old_node;
        }

        size++;
    }